

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Electron::SoundGenerator>,_false>::
set_input_rate(LowpassBase<Outputs::Speaker::PullLowpass<Electron::SoundGenerator>,_false> *this,
              float cycles_per_second)

{
  float fVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock_guard;
  float cycles_per_second_local;
  LowpassBase<Outputs::Speaker::PullLowpass<Electron::SoundGenerator>,_false> *this_local;
  
  lock_guard._M_device._4_4_ = cycles_per_second;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->filter_parameters_mutex_);
  fVar1 = (this->filter_parameters_).input_cycles_per_second;
  if ((fVar1 != lock_guard._M_device._4_4_) || (NAN(fVar1) || NAN(lock_guard._M_device._4_4_))) {
    (this->filter_parameters_).input_cycles_per_second = lock_guard._M_device._4_4_;
    (this->filter_parameters_).parameters_are_dirty = true;
    (this->filter_parameters_).input_rate_changed = true;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void set_input_rate(float cycles_per_second) {
			std::lock_guard lock_guard(filter_parameters_mutex_);
			if(filter_parameters_.input_cycles_per_second == cycles_per_second) {
				return;
			}
			filter_parameters_.input_cycles_per_second = cycles_per_second;
			filter_parameters_.parameters_are_dirty = true;
			filter_parameters_.input_rate_changed = true;
		}